

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

cbtBvhSubtreeInfo * __thiscall
cbtAlignedObjectArray<cbtBvhSubtreeInfo>::expand
          (cbtAlignedObjectArray<cbtBvhSubtreeInfo> *this,cbtBvhSubtreeInfo *fillValue)

{
  cbtBvhSubtreeInfo *pcVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  unsigned_short uVar5;
  unsigned_short uVar6;
  unsigned_short uVar7;
  int iVar8;
  int iVar9;
  
  iVar2 = this->m_size;
  iVar9 = iVar2;
  if (iVar2 == this->m_capacity) {
    iVar9 = 1;
    if (iVar2 != 0) {
      iVar9 = iVar2 * 2;
    }
    reserve(this,iVar9);
    iVar9 = this->m_size;
  }
  this->m_size = iVar9 + 1;
  uVar5 = fillValue->m_quantizedAabbMin[1];
  uVar6 = fillValue->m_quantizedAabbMin[2];
  uVar7 = fillValue->m_quantizedAabbMax[0];
  uVar3 = *(undefined8 *)(fillValue->m_quantizedAabbMax + 1);
  iVar9 = fillValue->m_subtreeSize;
  iVar8 = fillValue->m_padding[0];
  uVar4 = *(undefined8 *)(fillValue->m_padding + 1);
  pcVar1 = this->m_data + iVar2;
  pcVar1->m_quantizedAabbMin[0] = fillValue->m_quantizedAabbMin[0];
  pcVar1->m_quantizedAabbMin[1] = uVar5;
  pcVar1->m_quantizedAabbMin[2] = uVar6;
  pcVar1->m_quantizedAabbMax[0] = uVar7;
  *(undefined8 *)(pcVar1->m_quantizedAabbMax + 1) = uVar3;
  pcVar1->m_subtreeSize = iVar9;
  pcVar1->m_padding[0] = iVar8;
  *(undefined8 *)(pcVar1->m_padding + 1) = uVar4;
  return this->m_data + iVar2;
}

Assistant:

SIMD_FORCE_INLINE T& expand(const T& fillValue = T())
	{
		const int sz = size();
		if (sz == capacity())
		{
			reserve(allocSize(size()));
		}
		m_size++;
#ifdef BT_USE_PLACEMENT_NEW
		new (&m_data[sz]) T(fillValue);  //use the in-place new (not really allocating heap memory)
#endif

		return m_data[sz];
	}